

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_opt.c
# Opt level: O2

void av1_estimate_intra_mode
               (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int best_early_term,uint ref_cost_intra
               ,int reuse_prediction,buf_2d *orig_dst,PRED_BUFFER *tmp_buffers,
               PRED_BUFFER **this_mode_pred,RD_STATS *best_rdc,BEST_PICKMODE *best_pickmode,
               PICK_MODE_CONTEXT *ctx,uint *best_sad_norm)

{
  MACROBLOCKD *xd;
  uint64_t uVar1;
  uint64_t uVar2;
  byte tx_size;
  byte bVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  PREDICTION_MODE mode;
  BLOCK_SIZE plane_bsize;
  BLOCK_SIZE BVar6;
  ushort uVar7;
  ushort uVar8;
  aom_tune_content aVar9;
  uint uVar10;
  int iVar11;
  SOURCE_SAD SVar12;
  int iVar13;
  int iVar14;
  PRED_BUFFER *pPVar15;
  SequenceHeader *pSVar16;
  byte bVar17;
  bool bVar18;
  undefined4 uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  undefined7 in_register_00000011;
  int *piVar25;
  long lVar26;
  uint8_t *puVar27;
  byte bVar28;
  int iVar29;
  ulong uVar30;
  uint uVar31;
  ushort uVar32;
  long lVar33;
  ushort uVar34;
  uint8_t *puVar35;
  MB_MODE_INFO *pMVar36;
  RD_STATS local_f8;
  MB_MODE_INFO *local_d0;
  long local_c8;
  AV1_COMP *local_c0;
  MACROBLOCK *local_b8;
  PREDICTION_MODE local_b0;
  int local_ac;
  RD_STATS *local_a8;
  uint local_a0;
  undefined2 local_9c;
  ulong local_98;
  ulong local_90;
  int (*local_88) [7];
  uint8_t *local_80;
  uint8_t *local_78;
  int (*local_70) [169];
  int (*local_68) [169];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  uint8_t *local_40;
  uint8_t *local_38;
  
  pMVar36 = *(x->e_mbd).mi;
  uVar7 = *(ushort *)&pMVar36->field_0xa7;
  aVar9 = (cpi->oxcf).tune_cfg.content;
  iVar20 = av1_get_intra_cost_penalty
                     ((cpi->common).quant_params.base_qindex,(cpi->common).quant_params.y_dc_delta_q
                      ,((cpi->common).seq_params)->bit_depth);
  iVar22 = (cpi->sf).rt_sf.check_intra_pred_nonrd;
  if ((((0 < (cpi->svc).spatial_layer_id) && (best_pickmode->best_ref_frame != '\x04')) &&
      (lVar23 = (long)(cpi->svc).temporal_layer_id, 0 < lVar23)) &&
     ((cpi->svc).layer_context[lVar23].is_key_frame == 0)) {
    iVar22 = 0;
  }
  uVar31 = 0x32;
  if ((cpi->ppi->use_svc != 0) ||
     ((uVar32 = 0x20, uVar21 = uVar31, (cpi->sf).rt_sf.use_nonrd_altref_frame == 0 &&
      (0 < (cpi->sf).rt_sf.nonrd_prune_ref_frame_search)))) {
    uVar32 = 0;
    uVar21 = 0x96;
  }
  lVar23 = (long)((ulong)(iVar20 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
  uVar10 = x->source_variance;
  if (uVar21 <= uVar10) {
    bVar17 = 1;
    if ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0) {
      bVar18 = false;
    }
    else {
      bVar18 = false;
      if ((x->content_state_sb).source_sad_nonrd < kMedSad) {
        iVar22 = 0;
      }
    }
    goto LAB_00203e69;
  }
  bVar17 = 1;
  if (best_rdc->rdcost != 0x7fffffffffffffff) {
    if (best_pickmode->best_ref_frame == '\x01') {
      uVar8 = pMVar36->mv[0].as_mv.row;
      uVar34 = -uVar8;
      if (0 < (short)uVar8) {
        uVar34 = uVar8;
      }
      if (uVar34 < uVar32) {
        uVar8 = pMVar36->mv[0].as_mv.col;
        uVar34 = -uVar8;
        if (0 < (short)uVar8) {
          uVar34 = uVar8;
        }
        if (uVar34 < uVar32) goto LAB_00203d64;
      }
    }
    iVar20 = iVar20 >> 2;
    lVar23 = (long)((ulong)(iVar20 + ref_cost_intra) * (long)x->rdmult + 0x100) >> 9;
    bVar17 = 0;
  }
LAB_00203d64:
  if (0x32 < uVar21 >> 1) {
    uVar31 = uVar21 >> 1;
  }
  bVar18 = false;
  if ((uVar10 < uVar31) &&
     ((kMedSad < (x->content_state_sb).source_sad_nonrd ||
      ((bVar18 = false, uVar10 < 0x32 && aVar9 == AOM_CONTENT_SCREEN &&
       (((BLOCK_32X16 < bsize && ((x->content_state_sb).source_sad_nonrd != kZeroSad)) ||
        ((x->color_sensitivity[0] == '\x01' || (bVar18 = false, x->color_sensitivity[1] == '\x01')))
        ))))))) {
    bVar18 = true;
  }
  if (BLOCK_32X16 < bsize) {
    best_early_term = 0;
  }
LAB_00203e69:
  iVar29 = iVar22;
  if (((best_rdc->skip_txfm != '\0') && (best_pickmode->best_mode_initial_skip_flag != '\0')) &&
     (((iVar11 = (cpi->sf).rt_sf.skip_intra_pred, iVar11 != 1 ||
       (iVar29 = 0, best_pickmode->best_mode == '\x10')) && (iVar29 = iVar22, iVar11 == 2)))) {
    iVar29 = 0;
  }
  if ((best_rdc->rdcost == 0x7fffffffffffffff || bVar18) ||
     (((best_early_term == 0 && (iVar29 != 0)) && (bsize <= (cpi->sf).part_sf.max_intra_bsize)))) {
    lVar33 = lVar23 * 7 >> 3;
    if (aVar9 != AOM_CONTENT_SCREEN) {
      lVar33 = lVar23;
    }
    if (lVar33 <= best_rdc->rdcost) {
      local_a0 = 0xffffffff;
      local_9c = 0;
      uVar30 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
      if (((((cpi->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) && (10 < (cpi->oxcf).speed)) &&
          ((cpi->rc).high_source_sad != 0)) &&
         ((2 < (cpi->sf).rt_sf.prune_palette_search_nonrd ||
          ((((cpi->sf).rt_sf.rc_compute_spatial_var_sc != 0 &&
            ((cpi->rc).frame_spatial_variance < 0x4b0)) &&
           (((cpi->rc).perc_spatial_flat_blocks < 5 &&
            ((uVar10 < 4000 && (0x62 < (cpi->rc).percent_blocks_with_motion)))))))))) {
        local_9c = 0x100;
      }
      tx_size = ""[uVar30];
      bVar3 = ""[(x->txfm_search_params).tx_mode_search_type];
      if (tx_size < ""[(x->txfm_search_params).tx_mode_search_type]) {
        bVar3 = tx_size;
      }
      bVar28 = 2;
      if (bVar3 < 2) {
        bVar28 = bVar3;
      }
      bVar3 = bVar28;
      if ((aVar9 == AOM_CONTENT_SCREEN) && ((cpi->rc).high_source_sad != 0)) {
        bVar3 = 0;
        if (uVar10 <= uVar21) {
          bVar3 = bVar28;
        }
        if (BLOCK_16X16 < bsize) {
          bVar3 = bVar28;
        }
      }
      pPVar15 = best_pickmode->best_pred;
      local_d0 = pMVar36;
      local_c0 = cpi;
      local_b8 = x;
      if ((pPVar15 != (PRED_BUFFER *)0x0 && reuse_prediction != 0) &&
         (pPVar15->data == orig_dst->buf)) {
        uVar4 = block_size_wide[uVar30];
        uVar5 = block_size_high[uVar30];
        piVar25 = &tmp_buffers->in_use;
        lVar23 = -1;
        for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
          if (*piVar25 == 0) {
            *piVar25 = 1;
            lVar23 = lVar33;
            break;
          }
          piVar25 = piVar25 + 4;
        }
        *this_mode_pred = tmp_buffers + lVar23;
        (*aom_convolve_copy)
                  (pPVar15->data,(long)pPVar15->stride,tmp_buffers[lVar23].data,
                   (long)tmp_buffers[lVar23].stride,(int)uVar4,(int)uVar5);
        best_pickmode->best_pred = *this_mode_pred;
      }
      xd = &x->e_mbd;
      local_68 = (cpi->rd).threshes[uVar7 & 7] + uVar30;
      local_70 = x->thresh_freq_fact + uVar30;
      puVar27 = orig_dst->buf;
      puVar35 = orig_dst->buf0;
      iVar22 = orig_dst->height;
      iVar29 = orig_dst->stride;
      uVar19 = *(undefined4 *)&orig_dst->field_0x1c;
      (x->e_mbd).plane[0].dst.width = orig_dst->width;
      (x->e_mbd).plane[0].dst.height = iVar22;
      (x->e_mbd).plane[0].dst.stride = iVar29;
      *(undefined4 *)&(x->e_mbd).plane[0].dst.field_0x1c = uVar19;
      (x->e_mbd).plane[0].dst.buf = puVar27;
      (x->e_mbd).plane[0].dst.buf0 = puVar35;
      lVar23 = (long)(1 << (tx_size & 0x1f));
      local_88 = (x->mode_costs).angle_delta_cost;
      local_c8 = lVar23 * 4;
      local_98 = (ulong)((uint)(0x2f0bffL >> ((byte)uVar30 & 0x3f)) & 1);
      local_90 = (ulong)((uint)(0x1f07ffL >> ((byte)uVar30 & 0x3f)) & 1);
      pMVar36 = local_d0;
      for (lVar33 = 0; lVar33 != 4; lVar33 = lVar33 + 1) {
        mode = ""[lVar33];
        SVar12 = (x->content_state_sb).source_sad_nonrd;
        if ((((bool)(bVar18 & lVar33 != 3)) ||
            ((((uint)(cpi->sf).rt_sf.intra_y_mode_bsize_mask_nrd[uVar30] >>
               ((int)(char)mode & 0x1fU) & 1) != 0 &&
             (((lVar33 == 0 || ((cpi->sf).rt_sf.prune_hv_pred_modes_using_src_sad != true)) ||
              (((x->color_sensitivity[0] != '\0' && (x->color_sensitivity[1] != '\0')) &&
               (((uVar1 = (cpi->rc).frame_source_sad, uVar2 = (cpi->rc).avg_source_sad,
                 (((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) * 1.1 <
                 ((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) ||
                 ((uVar7 & 7) - 1 < 2)) || (kMedSad < SVar12)))))))))) &&
           (((aVar9 != AOM_CONTENT_SCREEN || ((cpi->sf).rt_sf.source_metrics_sb_nonrd == 0)) ||
            (((SVar12 != kZeroSad || ((lVar33 == 0 || (x->source_variance != 0)))) &&
             ((bsize < BLOCK_32X64 || (x->source_variance < 0x33)))))))) {
          if (((bool)(~bVar17 & lVar33 != 3)) ||
             ((*local_68)[mode_idx[0][*(long *)(&DAT_00462cc0 + (long)(char)mode * 8)]] !=
              0x7fffffff &&
              (long)(*local_70)[mode_idx[0][*(long *)(&DAT_00462cc0 + (long)(char)mode * 8)]] *
              (long)(*local_68)[mode_idx[0][*(long *)(&DAT_00462cc0 + (long)(char)mode * 8)]] >> 5
              <= best_rdc->rdcost)) {
            plane_bsize = av1_ss_size_lookup[uVar30][(x->e_mbd).plane[1].subsampling_x]
                          [(x->e_mbd).plane[1].subsampling_y];
            pMVar36->mode = mode;
            pMVar36->ref_frame[0] = '\0';
            pMVar36->ref_frame[1] = -1;
            local_f8.rate = 0x7fffffff;
            local_f8.zero_rate = 0;
            local_f8.dist = 0x7fffffffffffffff;
            local_f8.rdcost = 0x7fffffffffffffff;
            local_f8.sse = 0x7fffffffffffffff;
            local_f8.skip_txfm = '\0';
            local_ac = 1;
            local_a8 = &local_f8;
            pMVar36->tx_size = bVar3;
            pSVar16 = (cpi->common).seq_params;
            puVar27 = x->plane[0].src.buf;
            puVar35 = (x->e_mbd).plane[0].dst.buf;
            iVar22 = (x->e_mbd).plane[0].dst.stride;
            iVar29 = (x->e_mbd).plane[0].subsampling_x;
            iVar11 = (x->e_mbd).plane[0].subsampling_y;
            BVar6 = av1_ss_size_lookup[uVar30][iVar29][iVar11];
            bVar28 = block_size_wide[BVar6];
            iVar13 = (x->e_mbd).mb_to_right_edge;
            iVar14 = (x->e_mbd).mb_to_bottom_edge;
            local_50 = (long)((int)((iVar14 >> 0x1f & iVar14 >> ((char)iVar11 + 3U & 0x1f)) +
                                   (uint)block_size_high[BVar6]) >> 2);
            local_60 = iVar22 * local_c8;
            local_58 = x->plane[0].src.stride * local_c8;
            lVar24 = 0;
            local_b0 = mode;
            local_80 = puVar35;
            local_78 = puVar27;
            while (pMVar36 = local_d0, lVar24 < local_50) {
              local_48 = lVar24;
              local_40 = puVar35;
              local_38 = puVar27;
              for (lVar26 = 0;
                  lVar26 < (int)((iVar13 >> 0x1f & iVar13 >> ((char)iVar29 + 3U & 0x1f)) +
                                (uint)bVar28) >> 2; lVar26 = lVar26 + lVar23) {
                x->plane[0].src.buf = puVar27;
                (x->e_mbd).plane[0].dst.buf = puVar35;
                av1_predict_intra_block
                          (xd,pSVar16->sb_size,(uint)pSVar16->enable_intra_edge_filter,
                           (uint)block_size_wide[uVar30],(uint)block_size_high[uVar30],tx_size,mode,
                           0,0,'\x05',puVar35,iVar22,puVar35,iVar22,0,0,0);
                puVar35 = puVar35 + local_c8;
                puVar27 = puVar27 + local_c8;
              }
              puVar35 = local_40 + local_60;
              puVar27 = local_38 + local_58;
              lVar24 = local_48 + lVar23;
            }
            x->plane[0].src.buf = local_78;
            (x->e_mbd).plane[0].dst.buf = local_80;
            av1_block_yrd(x,&local_f8,&local_ac,bsize,local_d0->tx_size);
            if (x->color_sensitivity[0] != '\0') {
              av1_foreach_transformed_block_in_plane
                        (xd,plane_bsize,1,av1_estimate_block_intra,&local_c0);
            }
            if (x->color_sensitivity[1] != '\0') {
              av1_foreach_transformed_block_in_plane
                        (xd,plane_bsize,2,av1_estimate_block_intra,&local_c0);
            }
            iVar22 = 0;
            if ((BLOCK_8X4 < bsize) && (iVar22 = 0, 0xf7 < (byte)(mode - 9))) {
              iVar22 = local_88[(long)(char)mode + -1][(long)pMVar36->angle_delta[0] + 3];
            }
            if ((((lVar33 == 0) && (bsize != BLOCK_INVALID)) &&
                (((cpi->common).seq_params)->enable_filter_intra != '\0')) &&
               ((local_90 != 0 && (local_98 != 0)))) {
              iVar22 = iVar22 + (x->mode_costs).filter_intra_cost[uVar30][0];
            }
            iVar22 = iVar22 + iVar20 + ref_cost_intra + local_f8.rate;
            local_f8.rate = iVar22;
            local_f8.rdcost = local_f8.dist * 0x80 + ((long)x->rdmult * (long)iVar22 + 0x100 >> 9);
            if ((aVar9 == AOM_CONTENT_SCREEN) && ((cpi->sf).rt_sf.source_metrics_sb_nonrd != 0)) {
              if ((cpi->rc).high_source_sad == 0) {
                if ((((x->source_variance != 0) &&
                     ((x->content_state_sb).source_sad_nonrd == kZeroSad)) &&
                    (x->color_sensitivity[0] == '\0')) && (x->color_sensitivity[1] == '\0')) {
                  local_f8.rdcost = local_f8.rdcost + (local_f8.rdcost >> 1);
                }
              }
              else if ((x->source_variance < 800) &&
                      ((x->color_sensitivity[0] != '\0' || (x->color_sensitivity[1] != '\0')))) {
                local_f8.rdcost = local_f8.rdcost * 7 >> 3;
              }
            }
            if (local_f8.rdcost < best_rdc->rdcost) {
              *(ulong *)&best_rdc->skip_txfm = CONCAT71(local_f8._33_7_,local_f8.skip_txfm);
              best_rdc->rdcost = local_f8.rdcost;
              best_rdc->sse = local_f8.sse;
              best_rdc->rate = iVar22;
              best_rdc->zero_rate = local_f8.zero_rate;
              best_rdc->dist = local_f8.dist;
              best_pickmode->best_mode = mode;
              best_pickmode->best_tx_size = pMVar36->tx_size;
              best_pickmode->best_ref_frame = '\0';
              best_pickmode->best_second_ref_frame = '\0';
              best_pickmode->best_mode_skip_txfm = local_f8.skip_txfm;
              pMVar36->uv_mode = mode;
              pMVar36->mv[0] = (int_mv)0x80008000;
              pMVar36->mv[1] = (int_mv)0x80008000;
              if (local_f8.skip_txfm == '\0') {
                memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
              }
            }
          }
        }
      }
      if (best_pickmode->best_ref_frame == '\0') {
        memset(ctx->blk_skip,0,(long)ctx->num_4x4_blk);
      }
      pMVar36->tx_size = best_pickmode->best_tx_size;
      *best_sad_norm = local_a0 >> (""[uVar30] + ""[uVar30] & 0x1f);
    }
  }
  return;
}

Assistant:

void av1_estimate_intra_mode(AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bsize,
                             int best_early_term, unsigned int ref_cost_intra,
                             int reuse_prediction, struct buf_2d *orig_dst,
                             PRED_BUFFER *tmp_buffers,
                             PRED_BUFFER **this_mode_pred, RD_STATS *best_rdc,
                             BEST_PICKMODE *best_pickmode,
                             PICK_MODE_CONTEXT *ctx,
                             unsigned int *best_sad_norm) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const unsigned char segment_id = mi->segment_id;
  const int *const rd_threshes = cpi->rd.threshes[segment_id][bsize];
  const int *const rd_thresh_freq_fact = x->thresh_freq_fact[bsize];
  const bool is_screen_content =
      cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  const REAL_TIME_SPEED_FEATURES *const rt_sf = &cpi->sf.rt_sf;

  const CommonQuantParams *quant_params = &cm->quant_params;

  RD_STATS this_rdc;

  int intra_cost_penalty = av1_get_intra_cost_penalty(
      quant_params->base_qindex, quant_params->y_dc_delta_q,
      cm->seq_params->bit_depth);
  int64_t inter_mode_thresh =
      RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
  int perform_intra_pred = rt_sf->check_intra_pred_nonrd;
  int force_intra_check = 0;
  // For spatial enhancement layer: turn off intra prediction if the
  // previous spatial layer as golden ref is not chosen as best reference.
  // only do this for temporal enhancement layer and on non-key frames.
  if (cpi->svc.spatial_layer_id > 0 &&
      best_pickmode->best_ref_frame != GOLDEN_FRAME &&
      cpi->svc.temporal_layer_id > 0 &&
      !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame)
    perform_intra_pred = 0;

  int do_early_exit_rdthresh = 1;

  uint32_t spatial_var_thresh = 50;
  int motion_thresh = 32;
  // Adjust thresholds to make intra mode likely tested if the other
  // references (golden, alt) are skipped/not checked. For now always
  // adjust for svc mode.
  if (cpi->ppi->use_svc || (rt_sf->use_nonrd_altref_frame == 0 &&
                            rt_sf->nonrd_prune_ref_frame_search > 0)) {
    spatial_var_thresh = 150;
    motion_thresh = 0;
  }

  // Some adjustments to checking intra mode based on source variance.
  if (x->source_variance < spatial_var_thresh) {
    // If the best inter mode is large motion or non-LAST ref reduce intra cost
    // penalty, so intra mode is more likely tested.
    if (best_rdc->rdcost != INT64_MAX &&
        (best_pickmode->best_ref_frame != LAST_FRAME ||
         abs(mi->mv[0].as_mv.row) >= motion_thresh ||
         abs(mi->mv[0].as_mv.col) >= motion_thresh)) {
      intra_cost_penalty = intra_cost_penalty >> 2;
      inter_mode_thresh =
          RDCOST(x->rdmult, ref_cost_intra + intra_cost_penalty, 0);
      do_early_exit_rdthresh = 0;
    }
    if ((x->source_variance < AOMMAX(50, (spatial_var_thresh >> 1)) &&
         x->content_state_sb.source_sad_nonrd >= kHighSad) ||
        (is_screen_content && x->source_variance < 50 &&
         ((bsize >= BLOCK_32X32 &&
           x->content_state_sb.source_sad_nonrd != kZeroSad) ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 1 ||
          x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 1)))
      force_intra_check = 1;
    // For big blocks worth checking intra (since only DC will be checked),
    // even if best_early_term is set.
    if (bsize >= BLOCK_32X32) best_early_term = 0;
  } else if (rt_sf->source_metrics_sb_nonrd &&
             x->content_state_sb.source_sad_nonrd <= kLowSad) {
    perform_intra_pred = 0;
  }

  if (best_rdc->skip_txfm && best_pickmode->best_mode_initial_skip_flag) {
    if (rt_sf->skip_intra_pred == 1 && best_pickmode->best_mode != NEWMV)
      perform_intra_pred = 0;
    else if (rt_sf->skip_intra_pred == 2)
      perform_intra_pred = 0;
  }

  if (!(best_rdc->rdcost == INT64_MAX || force_intra_check ||
        (perform_intra_pred && !best_early_term &&
         bsize <= cpi->sf.part_sf.max_intra_bsize))) {
    return;
  }

  // Early exit based on RD cost calculated using known rate. When
  // is_screen_content is true, more bias is given to intra modes. Hence,
  // considered conservative threshold in early exit for the same.
  const int64_t known_rd = is_screen_content
                               ? CALC_BIASED_RDCOST(inter_mode_thresh)
                               : inter_mode_thresh;
  if (known_rd > best_rdc->rdcost) return;

  struct estimate_block_intra_args args;
  init_estimate_block_intra_args(&args, cpi, x);
  if (prune_palette_testing_inter(cpi, x->source_variance))
    args.prune_palette_sad = true;
  TX_SIZE intra_tx_size = AOMMIN(
      AOMMIN(max_txsize_lookup[bsize],
             tx_mode_to_biggest_tx_size[txfm_params->tx_mode_search_type]),
      TX_16X16);
  if (is_screen_content && cpi->rc.high_source_sad &&
      x->source_variance > spatial_var_thresh && bsize <= BLOCK_16X16)
    intra_tx_size = TX_4X4;

  PRED_BUFFER *const best_pred = best_pickmode->best_pred;
  if (reuse_prediction && best_pred != NULL) {
    const int bh = block_size_high[bsize];
    const int bw = block_size_wide[bsize];
    if (best_pred->data == orig_dst->buf) {
      *this_mode_pred = &tmp_buffers[get_pred_buffer(tmp_buffers, 3)];
      aom_convolve_copy(best_pred->data, best_pred->stride,
                        (*this_mode_pred)->data, (*this_mode_pred)->stride, bw,
                        bh);
      best_pickmode->best_pred = *this_mode_pred;
    }
  }
  pd->dst = *orig_dst;

  for (int midx = 0; midx < RTC_INTRA_MODES; ++midx) {
    const PREDICTION_MODE this_mode = intra_mode_list[midx];
    const THR_MODES mode_index = mode_idx[INTRA_FRAME][mode_offset(this_mode)];
    const int64_t mode_rd_thresh = rd_threshes[mode_index];

    if (is_prune_intra_mode(cpi, midx, force_intra_check, bsize, segment_id,
                            x->content_state_sb.source_sad_nonrd,
                            x->color_sensitivity))
      continue;

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For spatially flat blocks with zero motion only check
      // DC mode.
      if (x->content_state_sb.source_sad_nonrd == kZeroSad &&
          x->source_variance == 0 && this_mode != DC_PRED)
        continue;
      // Only test Intra for big blocks if spatial_variance is small.
      else if (bsize > BLOCK_32X32 && x->source_variance > 50)
        continue;
    }

    if (rd_less_than_thresh(best_rdc->rdcost, mode_rd_thresh,
                            rd_thresh_freq_fact[mode_index]) &&
        (do_early_exit_rdthresh || this_mode == SMOOTH_PRED)) {
      continue;
    }
    const BLOCK_SIZE uv_bsize =
        get_plane_block_size(bsize, xd->plane[AOM_PLANE_U].subsampling_x,
                             xd->plane[AOM_PLANE_U].subsampling_y);

    mi->mode = this_mode;
    mi->ref_frame[0] = INTRA_FRAME;
    mi->ref_frame[1] = NONE_FRAME;

    av1_invalid_rd_stats(&this_rdc);
    args.mode = this_mode;
    args.skippable = 1;
    args.rdc = &this_rdc;
    mi->tx_size = intra_tx_size;
    compute_intra_yprediction(cm, this_mode, bsize, x, xd);
    // Look into selecting tx_size here, based on prediction residual.
    av1_block_yrd(x, &this_rdc, &args.skippable, bsize, mi->tx_size);
    // TODO(kyslov@) Need to account for skippable
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_U,
                                             av1_estimate_block_intra, &args);
    }
    if (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]) {
      av1_foreach_transformed_block_in_plane(xd, uv_bsize, AOM_PLANE_V,
                                             av1_estimate_block_intra, &args);
    }

    int mode_cost = 0;
    if (av1_is_directional_mode(this_mode) && av1_use_angle_delta(bsize)) {
      mode_cost +=
          x->mode_costs.angle_delta_cost[this_mode - V_PRED]
                                        [MAX_ANGLE_DELTA +
                                         mi->angle_delta[PLANE_TYPE_Y]];
    }
    if (this_mode == DC_PRED && av1_filter_intra_allowed_bsize(cm, bsize)) {
      mode_cost += x->mode_costs.filter_intra_cost[bsize][0];
    }
    this_rdc.rate += ref_cost_intra;
    this_rdc.rate += intra_cost_penalty;
    this_rdc.rate += mode_cost;
    this_rdc.rdcost = RDCOST(x->rdmult, this_rdc.rate, this_rdc.dist);

    if (is_screen_content && rt_sf->source_metrics_sb_nonrd) {
      // For blocks with low spatial variance and color sad,
      // favor the intra-modes, only on scene/slide change.
      if (cpi->rc.high_source_sad && x->source_variance < 800 &&
          (x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] ||
           x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)]))
        this_rdc.rdcost = CALC_BIASED_RDCOST(this_rdc.rdcost);
      // Otherwise bias against intra for blocks with zero
      // motion and no color, on non-scene/slide changes.
      else if (!cpi->rc.high_source_sad && x->source_variance > 0 &&
               x->content_state_sb.source_sad_nonrd == kZeroSad &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_U)] == 0 &&
               x->color_sensitivity[COLOR_SENS_IDX(AOM_PLANE_V)] == 0)
        this_rdc.rdcost = (3 * this_rdc.rdcost) >> 1;
    }

    if (this_rdc.rdcost < best_rdc->rdcost) {
      *best_rdc = this_rdc;
      best_pickmode->best_mode = this_mode;
      best_pickmode->best_tx_size = mi->tx_size;
      best_pickmode->best_ref_frame = INTRA_FRAME;
      best_pickmode->best_second_ref_frame = NONE;
      best_pickmode->best_mode_skip_txfm = this_rdc.skip_txfm;
      mi->uv_mode = this_mode;
      mi->mv[0].as_int = INVALID_MV;
      mi->mv[1].as_int = INVALID_MV;
      if (!this_rdc.skip_txfm)
        memset(ctx->blk_skip, 0,
               sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
    }
  }
  if (best_pickmode->best_ref_frame == INTRA_FRAME)
    memset(ctx->blk_skip, 0,
           sizeof(x->txfm_search_info.blk_skip[0]) * ctx->num_4x4_blk);
  mi->tx_size = best_pickmode->best_tx_size;

  *best_sad_norm = args.best_sad >>
                   (b_width_log2_lookup[bsize] + b_height_log2_lookup[bsize]);
}